

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O0

bool __thiscall
zmq::ypipe_t<zmq::command_t,_16>::unwrite(ypipe_t<zmq::command_t,_16> *this,command_t *value_)

{
  command_t *pcVar1;
  command_t *__src;
  void *in_RSI;
  long in_RDI;
  command_t *this_00;
  
  this_00 = *(command_t **)(in_RDI + 0x50);
  pcVar1 = yqueue_t<zmq::command_t,_16>::back((yqueue_t<zmq::command_t,_16> *)(in_RDI + 8));
  if (this_00 != pcVar1) {
    yqueue_t<zmq::command_t,_16>::unpush((yqueue_t<zmq::command_t,_16> *)this_00);
    __src = yqueue_t<zmq::command_t,_16>::back((yqueue_t<zmq::command_t,_16> *)(in_RDI + 8));
    memcpy(in_RSI,__src,0x40);
  }
  return this_00 != pcVar1;
}

Assistant:

bool unwrite (T *value_)
    {
        if (_f == &_queue.back ())
            return false;
        _queue.unpush ();
        *value_ = _queue.back ();
        return true;
    }